

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setValue(CommonCore *this,InterfaceHandle handle,char *data,uint64_t len)

{
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar6;
  FederateState *this_01;
  InvalidIdentifier *this_02;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  GlobalHandle *target;
  pointer pGVar8;
  string_view fmt;
  string_view logMessageSource;
  string_view message;
  format_args args;
  string_view message_00;
  size_t sStack_2a0;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> subs;
  ActionMessage package;
  ActionMessage pub;
  ActionMessage local_e8;
  
  puVar6 = getHandleInfo(this,handle);
  if (puVar6 == (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    this_02 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar7 = "Handle not valid (setValue)";
    sStack_2a0 = 0x1b;
  }
  else {
    if (*(char *)((long)&puVar6[1]._M_t.
                         super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                         .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4) ==
        'p') {
      if ((((ulong)puVar6[1]._M_t.
                   super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                   .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl &
           0x1000000000000000) == 0) &&
         (*(char *)((long)&puVar6[1]._M_t.
                           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 5)
          == '\x01')) {
        this_01 = getFederateAt(this,(LocalFederateId)
                                     *(BaseType *)
                                      &puVar6[1]._M_t.
                                       super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                       .super__Head_base<0UL,_helics::BrokerObject_*,_false>.
                                       _M_head_impl);
        bVar3 = FederateState::checkAndSetValue(this_01,handle,data,len);
        if (bVar3) {
          iVar4 = FederateState::loggingLevel(this_01);
          if (0x11 < iVar4) {
            pcVar1 = (this_01->name)._M_dataplus._M_p;
            sVar2 = (this_01->name)._M_string_length;
            package._0_8_ =
                 puVar6[2]._M_t.
                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
            package._8_8_ =
                 puVar6[3]._M_t.
                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
            fmt.size_ = 0x4d;
            fmt.data_ = (char *)0x1c;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)&package;
            package._16_8_ = len;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&pub,(v11 *)"setting value for {} size {}",fmt,args);
            message_00._M_len._4_4_ = pub.source_handle.hid;
            message_00._M_len._0_4_ = pub.source_id.gid;
            logMessageSource._M_str = pcVar1;
            logMessageSource._M_len = sVar2;
            message_00._M_str = (char *)pub._0_8_;
            FederateState::logMessage(this_01,0x12,logMessageSource,message_00,false);
            std::__cxx11::string::~string((string *)&pub);
          }
          FederateState::getSubscribers(&subs,this_01,handle);
          if (subs.super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              subs.super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            if ((long)subs.
                      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)subs.
                      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start == 8) {
              ActionMessage::ActionMessage(&package,cmd_pub);
              package.source_handle.hid = handle.hid;
              package.source_id.gid =
                   *(BaseType *)
                    &(puVar6->_M_t).
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
              package._16_8_ =
                   *subs.
                    super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              iVar5 = FederateState::getCurrentIteration(this_01);
              package.counter = (uint16_t)iVar5;
              SmallBuffer::assign(&package.payload,data,len);
              package.actionTime.internalTimeCode = (this_01->allowed_send_time).internalTimeCode;
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&package);
            }
            else {
              ActionMessage::ActionMessage(&package,cmd_multi_message);
              package.source_handle.hid = handle.hid;
              package.source_id.gid =
                   *(BaseType *)
                    &(puVar6->_M_t).
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
              ActionMessage::ActionMessage(&pub,cmd_pub);
              pub.source_id.gid =
                   *(BaseType *)
                    &(puVar6->_M_t).
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
              pub.source_handle.hid = handle.hid;
              iVar5 = FederateState::getCurrentIteration(this_01);
              pub.counter = (uint16_t)iVar5;
              SmallBuffer::assign(&pub.payload,data,len);
              pub.actionTime.internalTimeCode = (this_01->allowed_send_time).internalTimeCode;
              this_00 = &(this->super_BrokerBase).actionQueue;
              for (pGVar8 = subs.
                            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pGVar8 != subs.
                            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pGVar8 = pGVar8 + 1) {
                pub._16_8_ = *pGVar8;
                iVar4 = appendMessage(&package,&pub);
                if (iVar4 < 0) {
                  gmlc::containers::
                  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                  ::push<helics::ActionMessage>(this_00,&package);
                  ActionMessage::ActionMessage(&local_e8,cmd_multi_message);
                  ActionMessage::operator=(&package,&local_e8);
                  ActionMessage::~ActionMessage(&local_e8);
                  package.source_id.gid =
                       *(BaseType *)
                        &(puVar6->_M_t).
                         super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                         .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
                  appendMessage(&package,&pub);
                }
              }
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              push<helics::ActionMessage>(this_00,&package);
              ActionMessage::~ActionMessage(&pub);
            }
            ActionMessage::~ActionMessage(&package);
          }
          std::_Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
          ~_Vector_base(&subs.
                         super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                       );
        }
      }
      return;
    }
    this_02 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar7 = "handle does not point to a publication";
    sStack_2a0 = 0x26;
  }
  message._M_str = pcVar7;
  message._M_len = sStack_2a0;
  InvalidIdentifier::InvalidIdentifier(this_02,message);
  __cxa_throw(this_02,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setValue(InterfaceHandle handle, const char* data, uint64_t len)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle not valid (setValue)"));
    }
    if (handleInfo->handleType != InterfaceType::PUBLICATION) {
        throw(InvalidIdentifier("handle does not point to a publication"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    if (!handleInfo->used) {
        return;  // if the value is not required do nothing
    }
    auto* fed = getFederateAt(handleInfo->local_fed_id);
    if (fed->checkAndSetValue(handle, data, len)) {
        if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
            fed->logMessage(HELICS_LOG_LEVEL_DATA,
                            fed->getIdentifier(),
                            fmt::format("setting value for {} size {}", handleInfo->key, len));
        }
        auto subs = fed->getSubscribers(handle);
        if (subs.empty()) {
            return;
        }
        if (subs.size() == 1) {
            ActionMessage pub(CMD_PUB);
            pub.source_id = handleInfo->getFederateId();
            pub.source_handle = handle;
            pub.setDestination(subs[0]);
            pub.counter = static_cast<uint16_t>(fed->getCurrentIteration());
            pub.payload.assign(data, len);
            pub.actionTime = fed->nextAllowedSendTime();
            actionQueue.push(std::move(pub));
            return;
        }
        ActionMessage package(CMD_MULTI_MESSAGE);
        package.source_id = handleInfo->getFederateId();
        package.source_handle = handle;

        ActionMessage pub(CMD_PUB);
        pub.source_id = handleInfo->getFederateId();
        pub.source_handle = handle;
        pub.counter = static_cast<uint16_t>(fed->getCurrentIteration());
        pub.payload.assign(data, len);
        pub.actionTime = fed->nextAllowedSendTime();

        for (auto& target : subs) {
            pub.setDestination(target);
            auto res = appendMessage(package, pub);
            if (res < 0)  // deal with max package size if there are a lot of subscribers
            {
                actionQueue.push(std::move(package));
                package = ActionMessage(CMD_MULTI_MESSAGE);
                package.source_id = handleInfo->getFederateId();
                package.source_handle = handle;
                appendMessage(package, pub);
            }
        }
        actionQueue.push(std::move(package));
    }
}